

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPIOClass.cpp
# Opt level: O0

int __thiscall GPIOClass::setdir_gpio(GPIOClass *this,string *dir)

{
  byte bVar1;
  undefined8 uVar2;
  ostream *poVar3;
  string *in_RSI;
  string *in_RDI;
  ofstream setdirgpio;
  string setdir_str;
  char *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  long local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  string local_58 [32];
  string local_38 [52];
  int local_4;
  
  std::operator+(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::__cxx11::string::~string(local_58);
  uVar2 = std::__cxx11::string::c_str();
  std::ofstream::ofstream(&local_268,uVar2,0x10);
  bVar1 = std::ios::operator!((ios *)((long)&local_268 + *(long *)(local_268 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::operator<<((ostream *)&local_268,in_RSI);
    std::ofstream::close();
    local_4 = 0;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             " OPERATION FAILED: Unable to set direction of GPIO");
    poVar3 = std::operator<<(poVar3,in_RDI);
    poVar3 = std::operator<<(poVar3," .");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_4 = -1;
  }
  std::ofstream::~ofstream(&local_268);
  std::__cxx11::string::~string(local_38);
  return local_4;
}

Assistant:

int GPIOClass::setdir_gpio(string dir)
{

    string setdir_str ="/sys/class/gpio/gpio" + this->gpionum + "/direction";
    ofstream setdirgpio(setdir_str.c_str()); // open direction file for gpio
        if (!setdirgpio){
            cout << " OPERATION FAILED: Unable to set direction of GPIO"<< this->gpionum <<" ."<< endl;
            return -1;
        }

        setdirgpio << dir; //write direction to direction file
        setdirgpio.close(); // close direction file
        return 0;
}